

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_group_begin_titled(nk_context *ctx,char *id,char *title,nk_flags flags)

{
  nk_window *win;
  long lVar1;
  nk_hash name;
  int iVar2;
  nk_table *iter;
  long lVar3;
  nk_table *pnVar4;
  nk_uint *y_offset;
  nk_uint value;
  nk_table *pnVar5;
  ulong uVar6;
  nk_uint *extraout_RDX;
  undefined7 uVar7;
  ulong uVar8;
  ulong uVar9;
  nk_uint *unaff_R13;
  bool bVar10;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4982,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4983,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4984,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  if (win->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4985,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  if (*id == '\0') {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (id[lVar1] != '\0');
  }
  name = nk_murmur_hash(id,(int)lVar3,2);
  pnVar4 = win->tables;
  pnVar5 = pnVar4;
  y_offset = extraout_RDX;
  do {
    if (pnVar5 == (nk_table *)0x0) {
      unaff_R13 = (nk_uint *)0x0;
      break;
    }
    uVar8 = (ulong)pnVar5->size;
    uVar7 = (undefined7)((ulong)y_offset >> 8);
    y_offset = (nk_uint *)CONCAT71(uVar7,uVar8 != 0);
    if (uVar8 == 0) {
LAB_0011d778:
      pnVar5 = pnVar5->next;
    }
    else {
      if (pnVar5->keys[0] == name) {
        y_offset = (nk_uint *)CONCAT71(uVar7,1);
        uVar9 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (uVar8 - 1 == uVar6) {
            y_offset = (nk_uint *)CONCAT71((int7)(uVar6 + 1 >> 8),uVar6 + 1 < uVar8);
            goto LAB_0011d778;
          }
          uVar9 = uVar6 + 1;
          lVar3 = uVar6 + 1;
          uVar6 = uVar9;
        } while (pnVar5->keys[lVar3] != name);
        y_offset = (nk_uint *)CONCAT71((int7)(uVar9 >> 8),uVar9 < uVar8);
      }
      pnVar5->seq = win->seq;
      unaff_R13 = pnVar5->values + uVar9;
    }
  } while ((char)y_offset == '\0');
  value = (nk_uint)pnVar5;
  if (unaff_R13 == (nk_uint *)0x0) {
    unaff_R13 = nk_add_value(ctx,win,name,value);
    y_offset = nk_add_value(ctx,win,name + 1,value);
    *y_offset = 0;
    *unaff_R13 = 0;
  }
  else {
    do {
      if (pnVar4 == (nk_table *)0x0) {
        y_offset = (nk_uint *)0x0;
        break;
      }
      uVar8 = (ulong)pnVar4->size;
      bVar10 = uVar8 != 0;
      if (uVar8 == 0) {
LAB_0011d7e8:
        pnVar4 = pnVar4->next;
      }
      else {
        if (pnVar4->keys[0] == name + 1) {
          bVar10 = true;
          uVar9 = 0;
        }
        else {
          uVar6 = 0;
          do {
            if (uVar8 - 1 == uVar6) {
              bVar10 = uVar6 + 1 < uVar8;
              goto LAB_0011d7e8;
            }
            uVar9 = uVar6 + 1;
            lVar3 = uVar6 + 1;
            uVar6 = uVar9;
          } while (pnVar4->keys[lVar3] != name + 1);
          bVar10 = uVar9 < uVar8;
        }
        pnVar4->seq = win->seq;
        y_offset = pnVar4->values + uVar9;
      }
    } while (!bVar10);
  }
  iVar2 = nk_group_scrolled_offset_begin(ctx,unaff_R13,y_offset,title,flags);
  return iVar2;
}

Assistant:

NK_API int
nk_group_begin_titled(struct nk_context *ctx, const char *id,
    const char *title, nk_flags flags)
{
    int id_len;
    nk_hash id_hash;
    struct nk_window *win;
    nk_uint *x_offset;
    nk_uint *y_offset;

    NK_ASSERT(ctx);
    NK_ASSERT(id);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !id)
        return 0;

    /* find persistent group scrollbar value */
    win = ctx->current;
    id_len = (int)nk_strlen(id);
    id_hash = nk_murmur_hash(id, (int)id_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, id_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, id_hash, 0);
        y_offset = nk_add_value(ctx, win, id_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, id_hash+1);
    return nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
}